

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.c
# Opt level: O0

int X509_CRL_match(X509_CRL *a,X509_CRL *b)

{
  int iVar1;
  int rv;
  uint local_20;
  uint local_4;
  
  if ((((ulong)a[1].sig_alg & 0x10000000000000) == 0) &&
     (((ulong)b[1].sig_alg & 0x10000000000000) == 0)) {
    iVar1 = memcmp(&a[1].base_crl_number,&b[1].base_crl_number,0x14);
    if (iVar1 < 0) {
      local_20 = 0xffffffff;
    }
    else {
      local_20 = (uint)(0 < iVar1);
    }
    local_4 = local_20;
  }
  else {
    local_4 = 0xfffffffe;
  }
  return local_4;
}

Assistant:

int X509_CRL_match(const X509_CRL *a, const X509_CRL *b)
{
    int rv;

    if ((a->flags & EXFLAG_NO_FINGERPRINT) == 0
            && (b->flags & EXFLAG_NO_FINGERPRINT) == 0)
        rv = memcmp(a->sha1_hash, b->sha1_hash, SHA_DIGEST_LENGTH);
    else
        return -2;

    return rv < 0 ? -1 : rv > 0;
}